

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O0

void __thiscall
Analyser_twoEquivalentVoiExternalVariablesIncludingPrimaryVariable_Test::TestBody
          (Analyser_twoEquivalentVoiExternalVariablesIncludingPrimaryVariable_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  char *pcVar2;
  element_type *peVar3;
  element_type *peVar4;
  size_type sVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_308;
  shared_ptr<libcellml::Logger> local_2b8;
  allocator<char> local_2a1;
  string local_2a0 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_280;
  vector<libcellml::Issue::ReferenceRule,_std::allocator<libcellml::Issue::ReferenceRule>_>
  local_268;
  vector local_250 [24];
  vector local_238 [30];
  ScopedTrace local_21a;
  allocator<char> local_219;
  string local_218 [6];
  ScopedTrace gtest_trace_663;
  allocator<char> local_1f1;
  string local_1f0 [32];
  shared_ptr<libcellml::Component> local_1d0;
  shared_ptr<libcellml::Variable> local_1c0;
  shared_ptr<libcellml::AnalyserExternalVariable> local_1b0;
  allocator<char> local_199;
  string local_198 [39];
  allocator<char> local_171;
  string local_170 [32];
  shared_ptr<libcellml::Component> local_150;
  shared_ptr<libcellml::Variable> local_140;
  shared_ptr<libcellml::AnalyserExternalVariable> local_130;
  undefined1 local_120 [8];
  AnalyserPtr analyser;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  iterator local_e0;
  size_type local_d8;
  undefined1 local_d0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expectedIssues;
  Message local_b0 [8];
  unsigned_long local_a8 [2];
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  allocator<char> local_71;
  string local_70 [32];
  string local_50 [32];
  undefined1 local_30 [8];
  ModelPtr model;
  ParserPtr parser;
  Analyser_twoEquivalentVoiExternalVariablesIncludingPrimaryVariable_Test *this_local;
  
  this_00 = &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  libcellml::Parser::create(SUB81(this_00,0));
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,"generator/hodgkin_huxley_squid_axon_model_1952/model.cellml",&local_71);
  fileContents(local_50);
  libcellml::Parser::parseModel((string *)local_30);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  local_a8[1] = 0;
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_a8[0] = libcellml::Logger::issueCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_98,"size_t(0)","parser->issueCount()",local_a8 + 1,local_a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(local_b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &expectedIssues.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyser.cpp"
               ,0x285,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &expectedIssues.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,local_b0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &expectedIssues.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,
             "Both variable \'time\' in component \'environment\' and variable \'time\' in component \'membrane\' are marked as external variables, but they are equivalent to variable \'time\' in component \'environment\', the primary variable of integration which cannot be used as an external variable."
             ,(allocator<char> *)
              ((long)&analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 7));
  analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _6_1_ = 0;
  local_e0 = &local_100;
  local_d8 = 1;
  this_01 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 5);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(this_01);
  __l._M_len = local_d8;
  __l._M_array = local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_d0,__l,this_01);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi + 5));
  local_308 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e0;
  do {
    local_308 = local_308 + -1;
    std::__cxx11::string::~string((string *)local_308);
  } while (local_308 != &local_100);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Analyser::create();
  peVar3 = std::__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_120);
  peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_170,"environment",&local_171);
  libcellml::ComponentEntity::component((string *)&local_150,SUB81(peVar4,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_150);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_198,"time",&local_199);
  libcellml::Component::variable((string *)&local_140);
  libcellml::AnalyserExternalVariable::create((shared_ptr *)&local_130);
  libcellml::Analyser::addExternalVariable((shared_ptr *)peVar3);
  std::shared_ptr<libcellml::AnalyserExternalVariable>::~shared_ptr(&local_130);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_140);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator(&local_199);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_150);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator(&local_171);
  peVar3 = std::__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_120);
  peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1f0,"membrane",&local_1f1);
  libcellml::ComponentEntity::component((string *)&local_1d0,SUB81(peVar4,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_1d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_218,"time",&local_219);
  libcellml::Component::variable((string *)&local_1c0);
  libcellml::AnalyserExternalVariable::create((shared_ptr *)&local_1b0);
  libcellml::Analyser::addExternalVariable((shared_ptr *)peVar3);
  std::shared_ptr<libcellml::AnalyserExternalVariable>::~shared_ptr(&local_1b0);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_1c0);
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator(&local_219);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_1d0);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  peVar3 = std::__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_120);
  libcellml::Analyser::analyseModel((shared_ptr *)peVar3);
  testing::ScopedTrace::ScopedTrace
            (&local_21a,
             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyser.cpp"
             ,0x297,"Issue occurred here.");
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_d0);
  expectedCellmlElementTypes((ulong)local_238,(CellmlElementType)sVar5);
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_d0);
  expectedLevels((ulong)local_250,(Level)sVar5);
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_d0);
  expectedReferenceRules((ulong)&local_268,(ReferenceRule)sVar5);
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2a0,
             "https://libcellml.org/documentation/guides/latest/runtime_codes/index?issue=ANALYSER_EXTERNAL_VARIABLE_VOI"
             ,&local_2a1);
  expectedUrls(&local_280,sVar5,local_2a0);
  std::shared_ptr<libcellml::Logger>::shared_ptr<libcellml::Analyser,void>
            (&local_2b8,(shared_ptr<libcellml::Analyser> *)local_120);
  expectEqualIssuesCellmlElementTypesLevelsReferenceRulesUrls
            ((vector *)local_d0,local_238,local_250,(vector *)&local_268,(vector *)&local_280,
             (shared_ptr *)&local_2b8);
  std::shared_ptr<libcellml::Logger>::~shared_ptr(&local_2b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_280);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  std::vector<libcellml::Issue::ReferenceRule,_std::allocator<libcellml::Issue::ReferenceRule>_>::
  ~vector(&local_268);
  std::vector<libcellml::Issue::Level,_std::allocator<libcellml::Issue::Level>_>::~vector
            ((vector<libcellml::Issue::Level,_std::allocator<libcellml::Issue::Level>_> *)local_250)
  ;
  std::vector<libcellml::CellmlElementType,_std::allocator<libcellml::CellmlElementType>_>::~vector
            ((vector<libcellml::CellmlElementType,_std::allocator<libcellml::CellmlElementType>_> *)
             local_238);
  testing::ScopedTrace::~ScopedTrace(&local_21a);
  std::shared_ptr<libcellml::Analyser>::~shared_ptr((shared_ptr<libcellml::Analyser> *)local_120);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_d0);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_30);
  std::shared_ptr<libcellml::Parser>::~shared_ptr
            ((shared_ptr<libcellml::Parser> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Analyser, twoEquivalentVoiExternalVariablesIncludingPrimaryVariable)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    const std::vector<std::string> expectedIssues = {
        "Both variable 'time' in component 'environment' and variable 'time' in component 'membrane' are marked as external variables, but they are equivalent to variable 'time' in component 'environment', the primary variable of integration which cannot be used as an external variable.",
    };

    auto analyser = libcellml::Analyser::create();

    analyser->addExternalVariable(libcellml::AnalyserExternalVariable::create(model->component("environment")->variable("time")));
    analyser->addExternalVariable(libcellml::AnalyserExternalVariable::create(model->component("membrane")->variable("time")));

    analyser->analyseModel(model);

    EXPECT_EQ_ISSUES_CELLMLELEMENTTYPES_LEVELS_REFERENCERULES_URLS(expectedIssues,
                                                                   expectedCellmlElementTypes(expectedIssues.size(), libcellml::CellmlElementType::VARIABLE),
                                                                   expectedLevels(expectedIssues.size(), libcellml::Issue::Level::MESSAGE),
                                                                   expectedReferenceRules(expectedIssues.size(), libcellml::Issue::ReferenceRule::ANALYSER_EXTERNAL_VARIABLE_VOI),
                                                                   expectedUrls(expectedIssues.size(), "https://libcellml.org/documentation/guides/latest/runtime_codes/index?issue=ANALYSER_EXTERNAL_VARIABLE_VOI"),
                                                                   analyser);
}